

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeDylinkSection(WasmBinaryWriter *this)

{
  string_view *psVar1;
  char *data;
  undefined *puVar2;
  int32_t start;
  int32_t iVar3;
  size_t sVar4;
  DylinkSection *pDVar5;
  Name *neededDynlib;
  string_view *psVar6;
  string_view name;
  
  pDVar5 = (this->wasm->dylinkSection)._M_t.
           super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
           super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
  if (pDVar5 == (DylinkSection *)0x0) {
    return;
  }
  if (pDVar5->isLegacy == true) {
    writeLegacyDylinkSection(this);
    return;
  }
  start = startSection<wasm::BinaryConsts::Section>(this,Custom);
  puVar2 = BinaryConsts::CustomSections::Dylink0;
  sVar4 = strlen(BinaryConsts::CustomSections::Dylink0);
  name._M_str = puVar2;
  name._M_len = sVar4;
  writeInlineString(this,name);
  iVar3 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkMemInfo);
  BufferWithRandomAccess::operator<<
            (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                              super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                              .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                             memorySize);
  BufferWithRandomAccess::operator<<
            (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                              super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                              .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                             memoryAlignment);
  BufferWithRandomAccess::operator<<
            (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                              super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                              .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                             tableSize);
  BufferWithRandomAccess::operator<<
            (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                              super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                              .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                             tableAlignment);
  finishSection(this,iVar3);
  pDVar5 = (this->wasm->dylinkSection)._M_t.
           super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
           super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
  if (*(pointer *)
       ((long)&(pDVar5->neededDynlibs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> +
       8) != *(pointer *)
              &(pDVar5->neededDynlibs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl) {
    iVar3 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkNeeded);
    pDVar5 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)*(pointer *)
                                                     ((long)&(pDVar5->neededDynlibs).
                                                                                                                          
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  + 8) -
                                             *(long *)&(pDVar5->neededDynlibs).
                                                                                                              
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  ._M_impl) >> 4));
    pDVar5 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    psVar1 = *(string_view **)
              ((long)&(pDVar5->neededDynlibs).
                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> + 8);
    for (psVar6 = *(string_view **)
                   &(pDVar5->neededDynlibs).
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl;
        psVar6 != psVar1; psVar6 = psVar6 + 1) {
      writeInlineString(this,*psVar6);
    }
    finishSection(this,iVar3);
    pDVar5 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
  }
  data = (pDVar5->tail).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
  writeData(this,data,
            (long)*(pointer *)
                   ((long)&(pDVar5->tail).super__Vector_base<char,_std::allocator<char>_>._M_impl +
                   8) - (long)data);
  finishSection(this,start);
  return;
}

Assistant:

void WasmBinaryWriter::writeDylinkSection() {
  if (!wasm->dylinkSection) {
    return;
  }

  if (wasm->dylinkSection->isLegacy) {
    writeLegacyDylinkSection();
    return;
  }

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::Dylink0);

  auto substart =
    startSubsection(BinaryConsts::CustomSections::Subsection::DylinkMemInfo);
  o << U32LEB(wasm->dylinkSection->memorySize);
  o << U32LEB(wasm->dylinkSection->memoryAlignment);
  o << U32LEB(wasm->dylinkSection->tableSize);
  o << U32LEB(wasm->dylinkSection->tableAlignment);
  finishSubsection(substart);

  if (wasm->dylinkSection->neededDynlibs.size()) {
    substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::DylinkNeeded);
    o << U32LEB(wasm->dylinkSection->neededDynlibs.size());
    for (auto& neededDynlib : wasm->dylinkSection->neededDynlibs) {
      writeInlineString(neededDynlib.str);
    }
    finishSubsection(substart);
  }

  writeData(wasm->dylinkSection->tail.data(), wasm->dylinkSection->tail.size());
  finishSection(start);
}